

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtManifoldResult.cpp
# Opt level: O1

void __thiscall
cbtManifoldResult::addContactPoint
          (cbtManifoldResult *this,cbtVector3 *normalOnBInWorld,cbtVector3 *pointInWorld,
          cbtScalar depth)

{
  int iVar1;
  cbtPersistentManifold *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *pcVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  cbtCollisionObjectWrapper *pcVar8;
  int insertIndex;
  cbtCollisionObject *pcVar9;
  int *piVar10;
  cbtCollisionObjectWrapper *pcVar11;
  undefined1 auVar12 [16];
  cbtScalar cVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined1 local_118 [16];
  float local_108 [2];
  cbtVector3 local_100;
  cbtVector3 local_f0;
  cbtScalar local_e0 [2];
  cbtScalar acStack_d8 [2];
  cbtVector3 local_d0;
  cbtScalar local_c0;
  float fStack_bc;
  float afStack_b8 [2];
  cbtScalar local_b0;
  undefined1 local_ac [8];
  cbtScalar cStack_a4;
  cbtScalar cStack_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  void *local_88;
  byte bStack_80;
  undefined7 uStack_7f;
  undefined1 auStack_78 [16];
  anon_union_4_2_6ad150e0_for_cbtManifoldPoint_22 local_68;
  anon_union_4_2_42dea85c_for_cbtManifoldPoint_24 local_64;
  undefined8 uStack_60;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  
  cVar13 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
  if (depth <= cVar13) {
    pcVar2 = this->m_manifoldPtr;
    pcVar3 = pcVar2->m_body0;
    pcVar4 = this->m_body0Wrap->m_collisionObject;
    fVar15 = depth * normalOnBInWorld->m_floats[0] + pointInWorld->m_floats[0];
    fVar5 = depth * normalOnBInWorld->m_floats[1] + pointInWorld->m_floats[1];
    fVar6 = depth * normalOnBInWorld->m_floats[2] + pointInWorld->m_floats[2];
    auVar12 = vinsertps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar5),0x10);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar16._4_12_ = SUB1612(auVar17 << 0x40,4);
    auVar14._4_12_ = auVar16._4_12_;
    auVar14._0_4_ = fVar6;
    if (pcVar3 == pcVar4) {
      fVar15 = fVar15 - (pcVar4->m_worldTransform).m_origin.m_floats[0];
      fVar5 = fVar5 - (pcVar4->m_worldTransform).m_origin.m_floats[1];
      fVar6 = fVar6 - (pcVar4->m_worldTransform).m_origin.m_floats[2];
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar4->m_worldTransform).m_basis.m_el[1].
                                                       m_floats[0])),ZEXT416((uint)fVar15),
                                ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar6),
                                ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[0]
                                       ));
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar4->m_worldTransform).m_basis.m_el[1].
                                                      m_floats[1])),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[1])
                              );
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),
                               ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[1])
                              );
      auVar17 = vinsertps_avx(auVar17,auVar7,0x10);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar4->m_worldTransform).m_basis.m_el[1].
                                                      m_floats[2])),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[2])
                              );
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),
                               ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[2])
                              );
      uVar18 = auVar7._0_4_;
      pcVar9 = this->m_body1Wrap->m_collisionObject;
    }
    else {
      pcVar9 = this->m_body1Wrap->m_collisionObject;
      fVar15 = fVar15 - (pcVar9->m_worldTransform).m_origin.m_floats[0];
      fVar5 = fVar5 - (pcVar9->m_worldTransform).m_origin.m_floats[1];
      fVar6 = fVar6 - (pcVar9->m_worldTransform).m_origin.m_floats[2];
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                       m_floats[0])),ZEXT416((uint)fVar15),
                                ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar6),
                                ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[0]
                                       ));
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                      m_floats[1])),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[1])
                              );
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),
                               ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[1])
                              );
      auVar17 = vinsertps_avx(auVar17,auVar7,0x10);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                      m_floats[2])),ZEXT416((uint)fVar15),
                               ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[2])
                              );
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),
                               ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[2])
                              );
      uVar18 = auVar7._0_4_;
      pcVar9 = pcVar4;
    }
    auVar16._0_4_ = uVar18;
    local_100.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17,auVar16);
    iVar1 = pcVar2->m_cachedPoints;
    fVar15 = pointInWorld->m_floats[0] - (pcVar9->m_worldTransform).m_origin.m_floats[0];
    fVar5 = pointInWorld->m_floats[1] - (pcVar9->m_worldTransform).m_origin.m_floats[1];
    fVar6 = pointInWorld->m_floats[2] - (pcVar9->m_worldTransform).m_origin.m_floats[2];
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[0])),ZEXT416((uint)fVar15),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[0]))
    ;
    auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar6),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[0]))
    ;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[1])),ZEXT416((uint)fVar15),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[1]))
    ;
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar6),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[1]))
    ;
    auVar17 = vinsertps_avx(auVar17,auVar16,0x10);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[2])),ZEXT416((uint)fVar15),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[2]))
    ;
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar6),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[2]))
    ;
    local_f0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar17,auVar16,0x28);
    _local_c0 = *(undefined8 *)normalOnBInWorld->m_floats;
    afStack_b8 = *(float (*) [2])(normalOnBInWorld->m_floats + 2);
    local_118 = ZEXT816(0) << 0x20;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    auStack_78 = SUB3216(ZEXT832(0),0) << 0x20;
    local_88 = (void *)0x0;
    bStack_80 = 0;
    uStack_7f = SUB327(ZEXT832(0),5);
    local_68.m_contactCFM = 0.0;
    local_64.m_contactERP = 0.0;
    uStack_60._0_4_ = 0.0;
    uStack_60._4_4_ = 0;
    local_d0.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12,auVar14);
    local_e0 = *(cbtScalar (*) [2])pointInWorld->m_floats;
    acStack_d8 = *(cbtScalar (*) [2])(pointInWorld->m_floats + 2);
    local_b0 = depth;
    _local_ac = local_118;
    insertIndex = cbtPersistentManifold::getCacheEntry(pcVar2,(cbtManifoldPoint *)local_118);
    cVar13 = (*gCalculateCombinedFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    local_ac._0_4_ = cVar13;
    cVar13 = (*gCalculateCombinedRestitutionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a0 = cVar13;
    cVar13 = (*gCalculateCombinedRollingFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    local_ac._4_4_ = cVar13;
    cVar13 = (*gCalculateCombinedSpinningFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a4 = cVar13;
    pcVar9 = this->m_body0Wrap->m_collisionObject;
    if (((pcVar9->m_collisionFlags & 0x80) != 0) ||
       ((this->m_body1Wrap->m_collisionObject->m_collisionFlags & 0x80) != 0)) {
      local_64.m_contactERP =
           (*gCalculateCombinedContactDampingCallback)(pcVar9,this->m_body1Wrap->m_collisionObject);
      local_68.m_contactCFM =
           (*gCalculateCombinedContactStiffnessCallback)
                     (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
      bStack_80 = bStack_80 | 8;
    }
    if (((this->m_body0Wrap->m_collisionObject->m_collisionFlags & 0x200) != 0) ||
       ((this->m_body1Wrap->m_collisionObject->m_collisionFlags & 0x200) != 0)) {
      bStack_80 = bStack_80 | 0x10;
    }
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx512vl(ZEXT416((uint)afStack_b8[0]),auVar12);
    if (auVar12._0_4_ <= 0.70710677) {
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fStack_bc * fStack_bc)),ZEXT416((uint)local_c0),
                                ZEXT416((uint)local_c0));
      fVar15 = auVar12._0_4_;
      if (fVar15 < 0.0) {
        local_40 = sqrtf(fVar15);
      }
      else {
        auVar12 = vsqrtss_avx(auVar12,auVar12);
        local_40 = auVar12._0_4_;
      }
      local_40 = 1.0 / local_40;
      local_58 = local_40 * -fStack_bc;
      local_54 = local_40 * local_c0;
      local_50 = 0.0;
      local_48 = local_54 * -afStack_b8[0];
      local_44 = local_58 * afStack_b8[0];
      local_40 = fVar15 * local_40;
    }
    else {
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(afStack_b8[0] * afStack_b8[0])),
                                ZEXT416((uint)fStack_bc),ZEXT416((uint)fStack_bc));
      fVar15 = auVar12._0_4_;
      if (fVar15 < 0.0) {
        local_48 = sqrtf(fVar15);
      }
      else {
        auVar12 = vsqrtss_avx(auVar12,auVar12);
        local_48 = auVar12._0_4_;
      }
      local_48 = 1.0 / local_48;
      local_58 = 0.0;
      local_54 = local_48 * -afStack_b8[0];
      local_50 = local_48 * fStack_bc;
      local_48 = fVar15 * local_48;
      local_44 = local_50 * -local_c0;
      local_40 = local_54 * local_c0;
    }
    if (pcVar3 == pcVar4) {
      local_9c = this->m_partId0;
      local_98 = this->m_partId1;
      local_94 = this->m_index0;
      piVar10 = &this->m_index1;
    }
    else {
      local_9c = this->m_partId1;
      local_98 = this->m_partId0;
      local_94 = this->m_index1;
      piVar10 = &this->m_index0;
    }
    local_90 = *piVar10;
    pcVar2 = this->m_manifoldPtr;
    if (insertIndex < 0) {
      insertIndex = cbtPersistentManifold::addManifoldPoint
                              (pcVar2,(cbtManifoldPoint *)local_118,false);
    }
    else {
      cbtPersistentManifold::replaceContactPoint(pcVar2,(cbtManifoldPoint *)local_118,insertIndex);
    }
    if ((gContactAddedCallback != (ContactAddedCallback)0x0) &&
       (((this->m_body0Wrap->m_collisionObject->m_collisionFlags & 8) != 0 ||
        ((this->m_body1Wrap->m_collisionObject->m_collisionFlags & 8) != 0)))) {
      pcVar11 = this->m_body0Wrap;
      pcVar8 = this->m_body1Wrap;
      if (pcVar3 == pcVar4) {
        pcVar11 = this->m_body1Wrap;
        pcVar8 = this->m_body0Wrap;
      }
      (*gContactAddedCallback)
                (this->m_manifoldPtr->m_pointCache + insertIndex,pcVar8,local_9c,local_94,pcVar11,
                 local_98,local_90);
    }
    if (gContactStartedCallback != (ContactStartedCallback)0x0 && iVar1 == 0) {
      (*gContactStartedCallback)(&this->m_manifoldPtr);
    }
  }
  return;
}

Assistant:

void cbtManifoldResult::addContactPoint(const cbtVector3& normalOnBInWorld, const cbtVector3& pointInWorld, cbtScalar depth)
{
	cbtAssert(m_manifoldPtr);
	//order in manifold needs to match

	if (depth > m_manifoldPtr->getContactBreakingThreshold()) {
		//	if (depth > m_manifoldPtr->getContactProcessingThreshold())
		return;
	}
	bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
	bool isNewCollision = m_manifoldPtr->getNumContacts() == 0;

	cbtVector3 pointA = pointInWorld + normalOnBInWorld * depth;

	cbtVector3 localA;
	cbtVector3 localB;

	if (isSwapped)
	{
		localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}
	else
	{
		localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}

	cbtManifoldPoint newPt(localA, localB, normalOnBInWorld, depth);
	newPt.m_positionWorldOnA = pointA;
	newPt.m_positionWorldOnB = pointInWorld;

	int insertIndex = m_manifoldPtr->getCacheEntry(newPt);

	newPt.m_combinedFriction = gCalculateCombinedFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRestitution = gCalculateCombinedRestitutionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRollingFriction = gCalculateCombinedRollingFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedSpinningFriction = gCalculateCombinedSpinningFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING))
	{
		newPt.m_combinedContactDamping1 = gCalculateCombinedContactDampingCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_combinedContactStiffness1 = gCalculateCombinedContactStiffnessCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_CONTACT_STIFFNESS_DAMPING;
	}

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR))
	{
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_FRICTION_ANCHOR;
	}

	cbtPlaneSpace1(newPt.m_normalWorldOnB, newPt.m_lateralFrictionDir1, newPt.m_lateralFrictionDir2);

	//BP mod, store contact triangles.
	if (isSwapped)
	{
		newPt.m_partId0 = m_partId1;
		newPt.m_partId1 = m_partId0;
		newPt.m_index0 = m_index1;
		newPt.m_index1 = m_index0;
	}
	else
	{
		newPt.m_partId0 = m_partId0;
		newPt.m_partId1 = m_partId1;
		newPt.m_index0 = m_index0;
		newPt.m_index1 = m_index1;
	}
	//printf("depth=%f\n",depth);
	///@todo, check this for any side effects
	if (insertIndex >= 0)
	{
		//const cbtManifoldPoint& oldPoint = m_manifoldPtr->getContactPoint(insertIndex);
		m_manifoldPtr->replaceContactPoint(newPt, insertIndex);
	}
	else
	{
		insertIndex = m_manifoldPtr->addManifoldPoint(newPt);
	}

	//User can override friction and/or restitution
	if (gContactAddedCallback &&
		//and if either of the two bodies requires custom material
		((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK) ||
		 (m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK)))
	{
		//experimental feature info, for per-triangle material etc.
		const cbtCollisionObjectWrapper* obj0Wrap = isSwapped ? m_body1Wrap : m_body0Wrap;
		const cbtCollisionObjectWrapper* obj1Wrap = isSwapped ? m_body0Wrap : m_body1Wrap;
		(*gContactAddedCallback)(m_manifoldPtr->getContactPoint(insertIndex), obj0Wrap, newPt.m_partId0, newPt.m_index0, obj1Wrap, newPt.m_partId1, newPt.m_index1);
	}

	if (gContactStartedCallback && isNewCollision)
	{
		gContactStartedCallback(m_manifoldPtr);
	}
}